

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)

{
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var1;
  void *pvVar2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  anon_union_8_2_4f9aec01_for_bnode_4 aVar4;
  code *pcVar5;
  int iVar6;
  bnode *pbVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ushort *__ptr;
  ushort *__ptr_00;
  char *pcVar11;
  char *pcVar12;
  bnode *pbVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  ushort uVar17;
  undefined8 unaff_R13;
  undefined4 *puVar18;
  undefined8 uStack_1b0;
  undefined4 uStack_1a4;
  long alStack_1a0 [11];
  undefined4 uStack_144;
  undefined1 auStack_140 [16];
  char acStack_130 [80];
  undefined8 auStack_e0 [15];
  undefined4 local_68 [12];
  undefined1 local_38 [8];
  timeval __test_begin;
  
  gettimeofday((timeval *)local_38,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar7 = (bnode *)malloc(0x1010);
  pbVar7->kvsize = 0;
  pbVar7->flag = 0;
  pbVar7->level = 0;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = (void *)0x0;
  pbVar7->kvsize = 0x801;
  pbVar7->level = 1;
  pbVar7->nentry = 0;
  (pbVar7->field_4).data = pbVar7 + 1;
  uVar15 = 0;
  pcVar12 = (char *)(auStack_e0 + 5);
  do {
    pcVar11 = pcVar12;
    pcVar12 = pcVar11 + -0x10;
    auStack_e0[uVar15 + 5] = pcVar12;
    pcVar11[-0x18] = -0x3f;
    pcVar11[-0x17] = '7';
    pcVar11[-0x16] = '\x10';
    pcVar11[-0x15] = '\0';
    pcVar11[-0x14] = '\0';
    pcVar11[-0x13] = '\0';
    pcVar11[-0x12] = '\0';
    pcVar11[-0x11] = '\0';
    sprintf(pcVar12,"key%d",uVar15 & 0xffffffff);
    local_68[uVar15] = (int)uVar15;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  puVar18 = local_68;
  p_Var1 = kv_ops->get_data_size;
  pcVar11[-0x18] = -0x15;
  pcVar11[-0x17] = '7';
  pcVar11[-0x16] = '\x10';
  pcVar11[-0x15] = '\0';
  pcVar11[-0x14] = '\0';
  pcVar11[-0x13] = '\0';
  pcVar11[-0x12] = '\0';
  pcVar11[-0x11] = '\0';
  pbVar13 = pbVar7;
  sVar8 = (*p_Var1)(pbVar7,(void *)0x0,auStack_e0 + 5,puVar18,2);
  if (sVar8 == 0x12) {
    lVar16 = 0;
    do {
      pvVar2 = (void *)auStack_e0[lVar16 + 5];
      p_Var3 = kv_ops->set_kv;
      builtin_strncpy(pcVar11 + -0x18,"\t8\x10",4);
      pcVar11[-0x14] = '\0';
      pcVar11[-0x13] = '\0';
      pcVar11[-0x12] = '\0';
      pcVar11[-0x11] = '\0';
      (*p_Var3)(pbVar7,(idx_t)lVar16,pvVar2,puVar18);
      lVar16 = lVar16 + 1;
      puVar18 = puVar18 + 1;
    } while (lVar16 != 10);
    pbVar7->nentry = 10;
    p_Var1 = kv_ops->get_data_size;
    builtin_strncpy(pcVar11 + -0x18,"68\x10",4);
    pcVar11[-0x14] = '\0';
    pcVar11[-0x13] = '\0';
    pcVar11[-0x12] = '\0';
    pcVar11[-0x11] = '\0';
    pbVar13 = pbVar7;
    sVar8 = (*p_Var1)(pbVar7,(void *)0x0,auStack_e0 + 5,local_68,10);
    if (sVar8 == 0xb4) {
      builtin_strncpy(pcVar11 + -0x18,"J8\x10",4);
      pcVar11[-0x14] = '\0';
      pcVar11[-0x13] = '\0';
      pcVar11[-0x12] = '\0';
      pcVar11[-0x11] = '\0';
      kv_get_str_data_size_test();
      return;
    }
  }
  else {
    builtin_strncpy(pcVar11 + -0x18,"\\8\x10",4);
    pcVar11[-0x14] = '\0';
    pcVar11[-0x13] = '\0';
    pcVar11[-0x12] = '\0';
    pcVar11[-0x11] = '\0';
    kv_get_str_data_size_test();
  }
  *(code **)(pcVar11 + -0x18) = kv_get_str_kv_size_test;
  kv_get_str_data_size_test();
  *(undefined4 **)(pcVar11 + -0x18) = puVar18;
  *(bnode **)(pcVar11 + -0x20) = pbVar7;
  *(btree_kv_ops **)(pcVar11 + -0x28) = kv_ops;
  pcVar11[-0xa0] = 'y';
  pcVar11[-0x9f] = '8';
  pcVar11[-0x9e] = '\x10';
  pcVar11[-0x9d] = '\0';
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  gettimeofday((timeval *)(pcVar11 + -0x38),(__timezone_ptr_t)0x0);
  pcVar11[-0xa0] = '~';
  pcVar11[-0x9f] = '8';
  pcVar11[-0x9e] = '\x10';
  pcVar11[-0x9d] = '\0';
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  memleak_start();
  pcVar12 = pcVar11 + -0x88;
  pcVar12[0] = 't';
  pcVar12[1] = 'e';
  pcVar12[2] = 's';
  pcVar12[3] = 't';
  pcVar12[4] = 's';
  pcVar12[5] = 't';
  pcVar12[6] = 'r';
  pcVar12[7] = 'i';
  pcVar11[-0x81] = 'i';
  pcVar11[-0x80] = 'n';
  pcVar11[-0x7f] = 'g';
  pcVar11[-0x7e] = '\0';
  pcVar11[-0xa0] = -0x60;
  pcVar11[-0x9f] = '8';
  pcVar11[-0x9e] = '\x10';
  pcVar11[-0x9d] = '\0';
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  sVar9 = strlen(pcVar12);
  pcVar11[-0x78] = (char)sVar9;
  pcVar11[-0x77] = '\x04';
  pcVar11[-0x8c] = '\x01';
  pcVar11[-0x8b] = '\0';
  pcVar11[-0x8a] = '\0';
  pcVar11[-0x89] = '\0';
  aVar4 = pbVar13[2].field_4;
  pcVar11[-0xa0] = -0x44;
  pcVar11[-0x9f] = '8';
  pcVar11[-0x9e] = '\x10';
  pcVar11[-0x9d] = '\0';
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  lVar16 = (*(code *)aVar4)(pcVar11 + -0x78,pcVar12);
  pcVar11[-0xa0] = -0x39;
  pcVar11[-0x9f] = '8';
  pcVar11[-0x9e] = '\x10';
  pcVar11[-0x9d] = '\0';
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  sVar9 = strlen(pcVar12);
  if (lVar16 != sVar9 + 4) {
    pcVar11[-0xa0] = -0x23;
    pcVar11[-0x9f] = '8';
    pcVar11[-0x9e] = '\x10';
    pcVar11[-0x9d] = '\0';
    pcVar11[-0x9c] = '\0';
    pcVar11[-0x9b] = '\0';
    pcVar11[-0x9a] = '\0';
    pcVar11[-0x99] = '\0';
    kv_get_str_kv_size_test();
  }
  aVar4 = pbVar13[2].field_4;
  pcVar11[-0xa0] = -0x11;
  pcVar11[-0x9f] = '8';
  pcVar11[-0x9e] = '\x10';
  pcVar11[-0x9d] = '\0';
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  uVar15 = (*(code *)aVar4)(pcVar11 + -0x78,0,pcVar11 + -0x8c);
  if (uVar15 != (byte)pcVar11[-0x77]) {
    builtin_strncpy(pcVar11 + -0xa0,"\x069\x10",4);
    pcVar11[-0x9c] = '\0';
    pcVar11[-0x9b] = '\0';
    pcVar11[-0x9a] = '\0';
    pcVar11[-0x99] = '\0';
    kv_get_str_kv_size_test();
  }
  pcVar12 = pcVar11 + -0x88;
  aVar4 = pbVar13[2].field_4;
  builtin_strncpy(pcVar11 + -0xa0,"\x189\x10",4);
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  sVar9 = (*(code *)aVar4)(pcVar11 + -0x78,pcVar12,0);
  builtin_strncpy(pcVar11 + -0xa0,"#9\x10",4);
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  sVar10 = strlen(pcVar12);
  if (sVar9 != sVar10) {
    builtin_strncpy(pcVar11 + -0xa0,"59\x10",4);
    pcVar11[-0x9c] = '\0';
    pcVar11[-0x9b] = '\0';
    pcVar11[-0x9a] = '\0';
    pcVar11[-0x99] = '\0';
    kv_get_str_kv_size_test();
  }
  pcVar14 = pcVar11 + -0x78;
  aVar4 = pbVar13[2].field_4;
  builtin_strncpy(pcVar11 + -0xa0,"A9\x10",4);
  pcVar11[-0x9c] = '\0';
  pcVar11[-0x9b] = '\0';
  pcVar11[-0x9a] = '\0';
  pcVar11[-0x99] = '\0';
  lVar16 = (*(code *)aVar4)(pcVar14,0,0);
  if (lVar16 == 0) {
    builtin_strncpy(pcVar11 + -0xa0,"K9\x10",4);
    pcVar11[-0x9c] = '\0';
    pcVar11[-0x9b] = '\0';
    pcVar11[-0x9a] = '\0';
    pcVar11[-0x99] = '\0';
    memleak_end();
    pcVar12 = "%s PASSED\n";
    if (kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass != '\0') {
      pcVar12 = "%s FAILED\n";
    }
    builtin_strncpy(pcVar11 + -0xa0,"|9\x10",4);
    pcVar11[-0x9c] = '\0';
    pcVar11[-0x9b] = '\0';
    pcVar11[-0x9a] = '\0';
    pcVar11[-0x99] = '\0';
    fprintf(_stderr,pcVar12,"kv_get_str_kv_size_test");
    return;
  }
  *(code **)(pcVar11 + -0xa0) = kv_copy_var_test;
  kv_get_str_kv_size_test();
  *(undefined1 **)(pcVar11 + -0xa0) = &stack0xfffffffffffffff8;
  *(char **)(pcVar11 + -0xa8) = pcVar12;
  *(size_t *)(pcVar11 + -0xb0) = sVar9;
  *(undefined8 *)(pcVar11 + -0xb8) = unaff_R13;
  pcVar11[-0xc0] = '\n';
  pcVar11[-0xbf] = '\0';
  pcVar11[-0xbe] = '\0';
  pcVar11[-0xbd] = '\0';
  pcVar11[-0xbc] = '\0';
  pcVar11[-0xbb] = '\0';
  pcVar11[-0xba] = '\0';
  pcVar11[-0xb9] = '\0';
  *(bnode **)(pcVar11 + -200) = pbVar13;
  *(char **)(pcVar11 + -0xe0) = pcVar14;
  pcVar11[-0xf8] = -0x56;
  pcVar11[-0xf7] = '9';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  gettimeofday((timeval *)(pcVar11 + -0xd8),(__timezone_ptr_t)0x0);
  pcVar11[-0xf8] = -0x51;
  pcVar11[-0xf7] = '9';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  memleak_start();
  pcVar12 = pcVar11 + -0xec;
  pcVar12[0] = 'k';
  pcVar12[1] = 'e';
  pcVar12[2] = 'y';
  pcVar12[3] = '\0';
  pcVar11[-0xf8] = -0x41;
  pcVar11[-0xf7] = '9';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  sVar9 = strlen(pcVar12);
  pcVar11[-0xe8] = '@';
  pcVar11[-0xe7] = '\0';
  pcVar11[-0xe6] = '\0';
  pcVar11[-0xe5] = '\0';
  pcVar11[-0xe4] = '\0';
  pcVar11[-0xe3] = '\0';
  pcVar11[-0xe2] = '\0';
  pcVar11[-0xe1] = '\0';
  pcVar11[-0xf8] = -0x28;
  pcVar11[-0xf7] = '9';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  __ptr = (ushort *)malloc(0x1010);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  __ptr[4] = 0;
  __ptr[5] = 0;
  __ptr[6] = 0;
  __ptr[7] = 0;
  uVar17 = (ushort)((int)sVar9 << 8) | 8;
  *__ptr = uVar17;
  __ptr[2] = 1;
  *(ushort **)(__ptr + 4) = __ptr + 8;
  pcVar11[-0xf8] = '\x10';
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  __ptr_00 = (ushort *)malloc(0x1010);
  __ptr_00[0] = 0;
  __ptr_00[1] = 0;
  __ptr_00[2] = 0;
  __ptr_00[3] = 0;
  __ptr_00[4] = 0;
  __ptr_00[5] = 0;
  __ptr_00[6] = 0;
  __ptr_00[7] = 0;
  *__ptr_00 = uVar17;
  __ptr_00[2] = 1;
  *(ushort **)(__ptr_00 + 4) = __ptr_00 + 8;
  lVar16 = *(long *)(pcVar11 + -0xe0);
  pcVar5 = *(code **)(lVar16 + 8);
  pcVar11[-0xf8] = 'E';
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  (*pcVar5)(__ptr_00,0,pcVar11 + -0xec,pcVar11 + -0xe8);
  pcVar5 = *(code **)(lVar16 + 0x18);
  pcVar11[-0xf8] = 'Y';
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  (*pcVar5)(__ptr,__ptr_00,0,0,1);
  pvVar2 = *(void **)(__ptr + 4);
  pcVar11[-0xf8] = 'l';
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  iVar6 = bcmp(pvVar2,pcVar11 + -0xec,sVar9 & 0xff);
  if (iVar6 != 0) {
    pcVar11[-0xf8] = -0x80;
    pcVar11[-0xf7] = ':';
    pcVar11[-0xf6] = '\x10';
    pcVar11[-0xf5] = '\0';
    pcVar11[-0xf4] = '\0';
    pcVar11[-0xf3] = '\0';
    pcVar11[-0xf2] = '\0';
    pcVar11[-0xf1] = '\0';
    kv_copy_var_test();
  }
  if (*(long *)(*(long *)(__ptr + 4) + (sVar9 & 0xff)) != *(long *)(pcVar11 + -0xe8)) {
    pcVar11[-0xf8] = -0x61;
    pcVar11[-0xf7] = ':';
    pcVar11[-0xf6] = '\x10';
    pcVar11[-0xf5] = '\0';
    pcVar11[-0xf4] = '\0';
    pcVar11[-0xf3] = '\0';
    pcVar11[-0xf2] = '\0';
    pcVar11[-0xf1] = '\0';
    kv_copy_var_test();
  }
  pcVar11[-0xf8] = -0x59;
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  free(__ptr_00);
  pcVar11[-0xf8] = -0x51;
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  free(__ptr);
  pcVar11[-0xf8] = -0x4c;
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  memleak_end();
  pcVar12 = "%s PASSED\n";
  if (kv_copy_var_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar12 = "%s FAILED\n";
  }
  pcVar11[-0xf8] = -0x1b;
  pcVar11[-0xf7] = ':';
  pcVar11[-0xf6] = '\x10';
  pcVar11[-0xf5] = '\0';
  pcVar11[-0xf4] = '\0';
  pcVar11[-0xf3] = '\0';
  pcVar11[-0xf2] = '\0';
  pcVar11[-0xf1] = '\0';
  fprintf(_stderr,pcVar12,"kv_copy_var_test");
  return;
}

Assistant:

void kv_get_str_data_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();


    bnoderef node;
    uint8_t v;
    uint8_t i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    int *value = alca(int, n);
    void *new_minkey;
    size_t size;


    node = dummy_node(ksize, vsize, 1);
    node->nentry = 0;

    new_minkey = NULL;

    for (i = 0; i < n; i++){
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        value[i] = i;
    }

    // calculate datasize to extend empty node
    size = kv_ops->get_data_size(node, new_minkey, key, value, 2);
    TEST_CHK(size == (size_t)(2*(ksize + vsize)));

    // set kvs
    for (i = 0; i < n; i++){
        kv_ops->set_kv(node, i, key[i], (void *)&value[i]);
    }

    // cacluate datasize to extend node with n entries
    node->nentry = n;
    size = kv_ops->get_data_size(node, new_minkey, key, value, n);
    TEST_CHK(size == (size_t)(2*(n*(ksize+vsize))));

    free(node);
    memleak_end();
    TEST_RESULT("kv_get_str_data_size_test");
}